

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

int array_getfields(t_symbol *elemtemplatesym,_glist **elemtemplatecanvasp,
                   t_template **elemtemplatep,int *elemsizep,_fielddesc *xfielddesc,
                   _fielddesc *yfielddesc,_fielddesc *wfielddesc,int *xonsetp,int *yonsetp,
                   int *wonsetp)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  t_template *ptVar4;
  t_symbol *ptVar5;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar6;
  char *pcVar7;
  float fVar8;
  ulong uVar9;
  char *fmt;
  uint uVar10;
  t_symbol **pptVar11;
  _fielddesc *p_Var12;
  uint uVar13;
  _glist *p_Var14;
  uint uVar15;
  
  p_Var12 = xfielddesc;
  ptVar4 = (t_template *)pd_findbyclass(elemtemplatesym,template_class);
  if (ptVar4 == (t_template *)0x0) {
    pcVar7 = elemtemplatesym->s_name;
    fmt = "plot: %s: no such template";
LAB_0015981d:
    pd_error((void *)0x0,fmt,pcVar7);
    iVar3 = -1;
  }
  else {
    if (elemtemplatesym == &s_float) {
      p_Var14 = (_glist *)0x0;
    }
    else {
      if (ptVar4->t_list == (_gtemplate *)0x0) {
        p_Var14 = (_glist *)0x0;
      }
      else {
        p_Var14 = ptVar4->t_list->x_owner;
      }
      if (p_Var14 == (_glist *)0x0) {
        pcVar7 = elemtemplatesym->s_name;
        fmt = "plot: %s: no canvas for this template";
        goto LAB_0015981d;
      }
    }
    iVar1 = ptVar4->t_n;
    if ((yfielddesc == (_fielddesc *)0x0) || (yfielddesc->fd_var == '\0')) {
      ptVar5 = gensym("y");
      lVar6 = extraout_RDX_00;
    }
    else {
      ptVar5 = (yfielddesc->fd_un).fd_symbol;
      lVar6 = extraout_RDX;
    }
    bVar2 = true;
    if (0 < (long)ptVar4->t_n) {
      pptVar11 = &ptVar4->t_vec->ds_name;
      lVar6 = 0;
      do {
        if (*pptVar11 == ptVar5) {
          yfielddesc = (_fielddesc *)(ulong)(uint)((t_dataslot *)(pptVar11 + -1))->ds_type;
          bVar2 = false;
          break;
        }
        pptVar11 = pptVar11 + 3;
        lVar6 = lVar6 + 8;
      } while ((long)ptVar4->t_n * 8 != lVar6);
    }
    fVar8 = SUB84(yfielddesc,0);
    uVar9 = (ulong)(uint)-(int)fVar8;
    uVar15 = 0xffffffff;
    if (!bVar2) {
      uVar15 = -(uint)(fVar8 != 0.0) | (uint)lVar6;
    }
    if ((xfielddesc == (_fielddesc *)0x0) || (xfielddesc->fd_var == '\0')) {
      ptVar5 = gensym("x");
    }
    else {
      ptVar5 = (xfielddesc->fd_un).fd_symbol;
    }
    bVar2 = true;
    if (0 < (long)ptVar4->t_n) {
      p_Var12 = (_fielddesc *)&ptVar4->t_vec->ds_name;
      uVar9 = 0;
      do {
        if (*(t_symbol **)p_Var12 == ptVar5) {
          fVar8 = p_Var12[-1].fd_quantum;
          bVar2 = false;
          break;
        }
        p_Var12 = (_fielddesc *)&p_Var12->fd_screen1;
        uVar9 = uVar9 + 8;
      } while ((long)ptVar4->t_n * 8 != uVar9);
    }
    uVar13 = 0xffffffff;
    if (!bVar2) {
      uVar13 = -(uint)(fVar8 != 0.0) | (uint)uVar9;
    }
    if ((wfielddesc == (_fielddesc *)0x0) || (wfielddesc->fd_var == '\0')) {
      ptVar5 = gensym("w");
    }
    else {
      ptVar5 = (wfielddesc->fd_un).fd_symbol;
    }
    bVar2 = true;
    if (0 < (long)ptVar4->t_n) {
      pptVar11 = &ptVar4->t_vec->ds_name;
      p_Var12 = (_fielddesc *)0x0;
      do {
        if (*pptVar11 == ptVar5) {
          fVar8 = (float)((t_dataslot *)(pptVar11 + -1))->ds_type;
          bVar2 = false;
          break;
        }
        pptVar11 = pptVar11 + 3;
        p_Var12 = (_fielddesc *)&p_Var12->fd_un;
      } while ((_fielddesc *)((long)ptVar4->t_n * 8) != p_Var12);
    }
    iVar3 = 0;
    uVar10 = 0xffffffff;
    if (!bVar2) {
      uVar10 = -(uint)(fVar8 != 0.0) | (uint)p_Var12;
    }
    *elemtemplatecanvasp = p_Var14;
    *elemtemplatep = ptVar4;
    *elemsizep = iVar1 << 3;
    *xonsetp = uVar13;
    *yonsetp = uVar15;
    *wonsetp = uVar10;
  }
  return iVar3;
}

Assistant:

int array_getfields(t_symbol *elemtemplatesym,
    t_canvas **elemtemplatecanvasp,
    t_template **elemtemplatep, int *elemsizep,
    t_fielddesc *xfielddesc, t_fielddesc *yfielddesc, t_fielddesc *wfielddesc,
    int *xonsetp, int *yonsetp, int *wonsetp)
{
    int arrayonset, elemsize, yonset, wonset, xonset, type;
    t_template *elemtemplate;
    t_symbol *dummy, *varname;
    t_canvas *elemtemplatecanvas = 0;

        /* the "float" template is special in not having to have a canvas;
        template_findbyname is hardwired to return a predefined
        template. */

    if (!(elemtemplate =  template_findbyname(elemtemplatesym)))
    {
        pd_error(0, "plot: %s: no such template", elemtemplatesym->s_name);
        return (-1);
    }
    if (!((elemtemplatesym == &s_float) ||
        (elemtemplatecanvas = template_findcanvas(elemtemplate))))
    {
        pd_error(0, "plot: %s: no canvas for this template", elemtemplatesym->s_name);
        return (-1);
    }
    elemsize = elemtemplate->t_n * sizeof(t_word);
    if (yfielddesc && yfielddesc->fd_var)
        varname = yfielddesc->fd_un.fd_varsym;
    else varname = gensym("y");
    if (!template_find_field(elemtemplate, varname, &yonset, &type, &dummy)
        || type != DT_FLOAT)
            yonset = -1;
    if (xfielddesc && xfielddesc->fd_var)
        varname = xfielddesc->fd_un.fd_varsym;
    else varname = gensym("x");
    if (!template_find_field(elemtemplate, varname, &xonset, &type, &dummy)
        || type != DT_FLOAT)
            xonset = -1;
    if (wfielddesc && wfielddesc->fd_var)
        varname = wfielddesc->fd_un.fd_varsym;
    else varname = gensym("w");
    if (!template_find_field(elemtemplate, varname, &wonset, &type, &dummy)
        || type != DT_FLOAT)
            wonset = -1;

        /* fill in slots for return values */
    *elemtemplatecanvasp = elemtemplatecanvas;
    *elemtemplatep = elemtemplate;
    *elemsizep = elemsize;
    *xonsetp = xonset;
    *yonsetp = yonset;
    *wonsetp = wonset;
    return (0);
}